

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O3

void ImPlot::PushColormap(ImPlotColormap colormap)

{
  int *__src;
  ImPlotContext *pIVar1;
  int iVar2;
  int *__dest;
  int iVar3;
  int iVar4;
  
  pIVar1 = GImPlot;
  if ((-1 < colormap) && (colormap < (GImPlot->ColormapData).Count)) {
    iVar2 = (GImPlot->ColormapModifiers).Size;
    if (iVar2 == (GImPlot->ColormapModifiers).Capacity) {
      if (iVar2 == 0) {
        iVar3 = 8;
      }
      else {
        iVar3 = iVar2 / 2 + iVar2;
      }
      iVar4 = iVar2 + 1;
      if (iVar2 + 1 < iVar3) {
        iVar4 = iVar3;
      }
      __dest = (int *)ImGui::MemAlloc((long)iVar4 << 2);
      __src = (pIVar1->ColormapModifiers).Data;
      if (__src != (int *)0x0) {
        memcpy(__dest,__src,(long)(pIVar1->ColormapModifiers).Size << 2);
        ImGui::MemFree((pIVar1->ColormapModifiers).Data);
      }
      (pIVar1->ColormapModifiers).Data = __dest;
      (pIVar1->ColormapModifiers).Capacity = iVar4;
      iVar2 = (pIVar1->ColormapModifiers).Size;
    }
    else {
      __dest = (GImPlot->ColormapModifiers).Data;
    }
    __dest[iVar2] = (pIVar1->Style).Colormap;
    (pIVar1->ColormapModifiers).Size = (pIVar1->ColormapModifiers).Size + 1;
    (pIVar1->Style).Colormap = colormap;
    return;
  }
  __assert_fail("(colormap >= 0 && colormap < gp.ColormapData.Count) && \"The colormap index is invalid!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                ,0xd18,"void ImPlot::PushColormap(ImPlotColormap)");
}

Assistant:

void PushColormap(ImPlotColormap colormap) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(colormap >= 0 && colormap < gp.ColormapData.Count, "The colormap index is invalid!");
    gp.ColormapModifiers.push_back(gp.Style.Colormap);
    gp.Style.Colormap = colormap;
}